

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluStrUtil.cpp
# Opt level: O2

ostream * eglu::operator<<(ostream *str,ConfigAttribListFmt *fmt)

{
  uint value;
  ConfigAttribValueFmt in_RAX;
  char *pcVar1;
  ostream *poVar2;
  int iVar3;
  Hex<8UL> hex;
  ConfigAttribValueFmt local_38;
  
  local_38 = in_RAX;
  std::operator<<(str,"{ ");
  iVar3 = 0;
  while( true ) {
    value = *(uint *)(*(long *)fmt + (long)iVar3 * 4);
    hex.value._4_4_ = 0;
    hex.value._0_4_ = value;
    if (iVar3 != 0) {
      std::operator<<(str,", ");
    }
    if (value == 0x3038) break;
    pcVar1 = getConfigAttribName(value);
    if (pcVar1 == (char *)0x0) {
      poVar2 = tcu::Format::operator<<(str,hex);
      pcVar1 = ", ???";
LAB_004c1492:
      std::operator<<(poVar2,pcVar1);
      std::operator<<(str," }");
      return str;
    }
    poVar2 = std::operator<<(str,pcVar1);
    poVar2 = std::operator<<(poVar2,", ");
    local_38.value = *(int *)(*(long *)fmt + (long)(iVar3 + 1) * 4);
    local_38.attribute = value;
    operator<<(poVar2,&local_38);
    iVar3 = iVar3 + 2;
  }
  pcVar1 = "EGL_NONE";
  poVar2 = str;
  goto LAB_004c1492;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const ConfigAttribListFmt& fmt)
{
	int pos = 0;

	str << "{ ";

	for (;;)
	{
		int attrib = fmt.attribs[pos];

		if (pos != 0)
			str << ", ";

		if (attrib == EGL_NONE)
		{
			// Terminate.
			str << "EGL_NONE";
			break;
		}

		const char*	attribName = getConfigAttribName(attrib);

		if (attribName)
		{
			// Valid attribute, print value.
			str << attribName << ", " << getConfigAttribValueStr(attrib, fmt.attribs[pos+1]);
			pos += 2;
		}
		else
		{
			// Invalid attribute. Terminate parsing.
			str << tcu::toHex(attrib) << ", ???";
			break;
		}
	}

	str << " }";
	return str;
}